

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int32_t icu_63::ICU_Utility::skipWhitespace(UnicodeString *str,int32_t *pos,UBool advance)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  UChar *pUVar5;
  int iVar6;
  
  iVar2 = *pos;
  pcVar4 = icu_63::UnicodeString::getBuffer(str);
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (str->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  pUVar5 = PatternProps::skipWhiteSpace(pcVar4 + iVar2,iVar6 - iVar2);
  iVar3 = (int32_t)((ulong)((long)pUVar5 - (long)pcVar4) >> 1);
  if (advance != '\0') {
    *pos = iVar3;
  }
  return iVar3;
}

Assistant:

int32_t ICU_Utility::skipWhitespace(const UnicodeString& str, int32_t& pos,
                                    UBool advance) {
    int32_t p = pos;
    const UChar* s = str.getBuffer();
    p = (int32_t)(PatternProps::skipWhiteSpace(s + p, str.length() - p) - s);
    if (advance) {
        pos = p;
    }
    return p;
}